

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sector.cpp
# Opt level: O2

Merge __thiscall Sector::add(Sector *this,Data *new_data,bool bad_crc,uint8_t new_dam)

{
  vector<Data,_std::allocator<Data>_> *this_00;
  uint8_t uVar1;
  uint8_t *puVar2;
  uchar *__first2;
  uchar *__last1;
  uchar *__first1;
  uchar *__last1_00;
  pointer pDVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  size_t sVar5;
  bool bVar6;
  int iVar7;
  iterator __position;
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  Data *d;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  Merge local_a8;
  vector<Data,_std::allocator<Data>_> *__range2;
  _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
  local_60;
  
  if (this->m_bad_id_crc != false) {
    return Unchanged;
  }
  if (bad_crc) {
    bVar6 = has_good_data(this);
    if (bVar6) {
      return Unchanged;
    }
  }
  else if (this->m_bad_data_crc == true) {
    local_a8 = Improved;
    remove_data(this);
    goto LAB_00172e7a;
  }
  local_a8 = NewData;
LAB_00172e7a:
  bVar6 = is_8k_sector(this);
  if (bVar6) {
    puVar2 = (new_data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    ChecksumMethods((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                    &local_60,puVar2,
                    *(int *)&(new_data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>)
                             .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (int)puVar2);
    sVar5 = local_60._M_impl.super__Rb_tree_header._M_node_count;
    std::
    _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
    ::~_Rb_tree(&local_60);
    if (sVar5 == 0) {
      pDVar3 = (this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((int)(((long)(this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pDVar3) / 0x18) == 1) {
        puVar2 = *(uint8_t **)
                  &(pDVar3->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
        ChecksumMethods((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *
                        )&local_60,puVar2,
                        *(int *)((long)&(pDVar3->
                                        super_vector<unsigned_char,_std::allocator<unsigned_char>_>)
                                        .
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl + 8) - (int)puVar2);
        std::
        _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
        ::~_Rb_tree(&local_60);
        if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
          return Unchanged;
        }
      }
    }
    else {
      remove_data(this);
      local_a8 = Improved;
    }
  }
  bVar6 = is_8k_sector(this);
  iVar8 = 0x1800;
  if (!bVar6) {
    iVar8 = *(int *)&(new_data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
            *(int *)&(new_data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
  }
  this_00 = &this->m_data;
  __position._M_current =
       (this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
       super__Vector_impl_data._M_start;
LAB_00172f4a:
  lVar9 = -(long)__position._M_current;
  do {
    if (__position._M_current ==
        (this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pDVar3 = (this_00->super__Vector_base<Data,_std::allocator<Data>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < (int)(-((long)&(pDVar3->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl + lVar9) / 0x18)) {
        uVar1 = this->dam;
        if (uVar1 != new_dam) {
          if (uVar1 == 0xfb) {
            return Unchanged;
          }
          if (new_dam != 0xfb && uVar1 == 0xf8) {
            return Unchanged;
          }
        }
        if (this->m_bad_data_crc != true) {
          return Unchanged;
        }
        iVar10 = *(int *)&(new_data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                 *(int *)&(new_data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
        iVar8 = *(int *)((long)&(pDVar3->super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                ).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl + 8) -
                *(int *)&(pDVar3->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
        if (iVar10 <= iVar8) {
          iVar8 = iVar10;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&new_data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                   (long)iVar8);
        pvVar4 = &((this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                   super__Vector_impl_data._M_finish)->
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        for (this_01 = &((this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                         super__Vector_impl_data._M_start)->
                        super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
            this_01 != pvVar4; this_01 = this_01 + 1) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_01,(long)iVar8);
        }
      }
      std::vector<Data,_std::allocator<Data>_>::emplace_back<Data>(this_00,new_data);
      limit_copies(this,opt.maxcopies);
      this->m_bad_data_crc = bad_crc;
      this->dam = new_dam;
      return local_a8;
    }
    __first2 = ((__position._M_current)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>
               ).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    __last1 = ((__position._M_current)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>)
              .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish;
    iVar10 = (int)__last1 - (int)__first2;
    __first1 = (new_data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    __last1_00 = (new_data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    iVar11 = (int)__last1_00 - (int)__first1;
    if (((iVar8 <= iVar10) && (iVar8 <= iVar11)) &&
       (iVar7 = bcmp(__first2,__first1,(long)iVar8), iVar7 == 0)) {
      return Unchanged;
    }
    if (iVar10 < iVar11) {
      bVar6 = std::__equal<true>::equal<unsigned_char>(__first2,__last1,__first1);
      if (bVar6) break;
    }
    else {
      bVar6 = std::__equal<true>::equal<unsigned_char>(__first1,__last1_00,__first2);
      if (bVar6) {
        iVar10 = *(int *)&(new_data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                 *(int *)&(new_data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
        if (*(int *)&((__position._M_current)->
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
            *(int *)&((__position._M_current)->
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start == iVar10) {
          return Unchanged;
        }
        if (iVar10 < iVar8) {
          return Unchanged;
        }
        goto LAB_0017302a;
      }
    }
    __position._M_current = __position._M_current + 1;
    lVar9 = lVar9 + -0x18;
  } while( true );
  if (iVar8 <= *(int *)&((__position._M_current)->
                        super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
               *(int *)&((__position._M_current)->
                        super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start) {
    return Unchanged;
  }
LAB_0017302a:
  __position = std::vector<Data,_std::allocator<Data>_>::erase
                         (this_00,(const_iterator)__position._M_current);
  local_a8 = Improved;
  goto LAB_00172f4a;
}

Assistant:

Sector::Merge Sector::add(Data&& new_data, bool bad_crc, uint8_t new_dam)
{
    Merge ret = Merge::NewData;

    // If the sector has a bad header CRC, it can't have any data
    if (has_badidcrc())
        return Merge::Unchanged;

#ifdef _DEBUG
    // If there's enough data, check the CRC
    if ((encoding == Encoding::MFM || encoding == Encoding::FM) &&
        static_cast<int>(new_data.size()) >= (size() + 2))
    {
        CRC16 crc;
        if (encoding == Encoding::MFM) crc.init(CRC16::A1A1A1);
        crc.add(new_dam);
        auto bad_data_crc = crc.add(new_data.data(), size() + 2) != 0;
        assert(bad_crc == bad_data_crc);
    }
#endif

    // If the exising sector has good data, ignore supplied data if it's bad
    if (bad_crc && has_good_data())
        return Merge::Unchanged;

    // If the existing sector is bad, new good data will replace it all
    if (!bad_crc && has_baddatacrc())
    {
        remove_data();
        ret = Merge::Improved;
    }

    // 8K sectors always have a CRC error, but may include a secondary checksum
    if (is_8k_sector())
    {
        // Attempt to identify the 8K checksum method used by the new data
        // If it's recognised, replace any existing data with it
        if (!ChecksumMethods(new_data.data(), new_data.size()).empty())
        {
            remove_data();
            ret = Merge::Improved;
        }
        // Do we already have a copy?
        else if (copies() == 1)
        {
            // Can we identify the method used by the existing copy?
            if (!ChecksumMethods(m_data[0].data(), m_data[0].size()).empty())
            {
                // Keep the existing, ignoring the new data
                return Merge::Unchanged;
            }
        }
    }

    // DD 8K sectors are considered complete at 6K, everything else at natural size
    auto complete_size = is_8k_sector() ? 0x1800 : new_data.size();

    // Compare existing data with the new data, to avoid storing redundant copies.
    for (auto it = m_data.begin(); it != m_data.end(); )
    {
        auto& data = *it;

        if (data.size() >= complete_size && new_data.size() >= complete_size)
        {
            // If the complete area of the data matches, ignore the new copy.
            if (!std::memcmp(data.data(), new_data.data(), complete_size))
                return Merge::Unchanged;
        }

        // Existing data is the same size or larger?
        if (data.size() >= new_data.size())
        {
            // Compare the prefix of each.
            if (std::equal(new_data.begin(), new_data.end(), data.begin()))
            {
                // If identical, or new is shorter than complete size, ignore it.
                if (data.size() == new_data.size() || new_data.size() < complete_size)
                    return Merge::Unchanged;

                // The new shorter copy replaces the existing data.
                it = m_data.erase(it);
                ret = Merge::Improved;
                continue;
            }
        }
        else // existing is shorter
        {
            // Compare the prefix of each.
            if (std::equal(data.begin(), data.end(), new_data.begin()))
            {
                // If the existing data is at least complete size, ignore the new data.
                if (data.size() >= complete_size)
                    return Merge::Unchanged;

                // The new longer copy replaces the existing data.
                it = m_data.erase(it);
                ret = Merge::Improved;
                continue;
            }
        }

        ++it;
    }

    // Will we now have multiple copies?
    if (copies() > 0)
    {
        // Damage can cause us to see different DAM values for a sector.
        // Favour normal over deleted, and deleted over anything else.
        if (dam != new_dam &&
            (dam == 0xfb || (dam == 0xf8 && new_dam != 0xfb)))
        {
            return Merge::Unchanged;
        }

        // Multiple good copies mean a difference in the gap data after
        // a good sector, perhaps due to a splice. We just ignore it.
        if (!has_baddatacrc())
            return Merge::Unchanged;

        // Keep multiple copies the same size, whichever is shortest
        auto new_size = std::min(new_data.size(), m_data[0].size());
        new_data.resize(new_size);

        // Resize any existing copies to match
        for (auto& d : m_data)
            d.resize(new_size);
    }

    // Insert the new data copy.
    m_data.emplace_back(std::move(new_data));
    limit_copies(opt.maxcopies);

    // Update the data CRC state and DAM
    m_bad_data_crc = bad_crc;
    dam = new_dam;

    return ret;
}